

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

size_t rtosc_print_arg_val(rtosc_arg_val_t *arg,char *buffer,size_t bs,rtosc_print_options *opt,
                          int *cols_used,rtosc_arg_val_t *prev_arg_if_range)

{
  rtosc_arg_t *arg_00;
  _Bool _Var1;
  int _n2;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  undefined1 *opt_00;
  size_t sVar6;
  ushort **ppuVar7;
  tm_conflict *__tp;
  uint64_t uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  rtosc_arg_val_t *arg_01;
  rtosc_arg_val_t *prVar16;
  ulong uVar17;
  ulong uVar18;
  rtosc_arg_val_t *prev_arg_if_range_00;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  long lVar22;
  char cVar23;
  bool bVar24;
  float fVar25;
  undefined8 uStack_f0;
  undefined1 auStack_e8 [16];
  rtosc_arg_val_t m_one;
  rtosc_arg_val_t second;
  undefined1 local_a0 [8];
  char fmtstr [9];
  size_t local_50;
  char *local_48;
  char *local_38;
  
  opt_00 = _compoundliteral;
  if (opt != (rtosc_print_options *)0x0) {
    opt_00 = &opt->lossless;
  }
  arg_00 = &arg->val;
  bVar15 = arg->type;
  pcVar21 = (char *)0x0;
  local_48 = (char *)0x0;
  if (bVar15 < 0x53) {
    if (0x48 < bVar15) {
      if (bVar15 == 0x49) {
        pcVar21 = "inf";
      }
      else {
        if (bVar15 != 0x4e) goto switchD_0010c7de_caseD_65;
        pcVar21 = "nil";
      }
      uStack_f0 = 0x10c9e9;
      fast_strcpy(buffer,pcVar21,bs);
      local_48 = (char *)0x3;
      goto switchD_0010c7de_caseD_65;
    }
    if (bVar15 != 0x2d) {
      local_48 = pcVar21;
      if (bVar15 == 0x46) {
        uStack_f0 = 0x10c8a4;
        fast_strcpy(buffer,"false",bs);
        local_48 = (char *)0x5;
      }
      goto switchD_0010c7de_caseD_65;
    }
    if (((rtosc_print_options *)opt_00)->compress_ranges == 0) {
      uStack_f0 = 0x10cfe7;
      iVar2 = rtosc_arg_rep_num(arg_00);
      if (iVar2 == 0) goto LAB_0010c912;
      local_48 = (char *)0x0;
      iVar2 = 0;
      local_38 = buffer;
    }
    else {
LAB_0010c912:
      uStack_f0 = 0x10c91a;
      iVar2 = rtosc_arg_rep_has_delta(arg_00);
      if (iVar2 == 0) {
        uStack_f0 = 0x10d12f;
        iVar2 = rtosc_arg_rep_num(arg_00);
        if (iVar2 != 0) {
          uStack_f0 = 0x10d13f;
          uVar13 = rtosc_arg_rep_num(arg_00);
          uStack_f0 = 0x10d159;
          iVar4 = asnprintf(buffer,bs,"%dx",(ulong)uVar13);
          lVar22 = (long)iVar4;
          *cols_used = *cols_used + iVar4;
          uStack_f0 = 0x10d182;
          sVar6 = rtosc_print_arg_val(arg + 1,buffer + lVar22,bs - lVar22,
                                      (rtosc_print_options *)opt_00,cols_used,(rtosc_arg_val_t *)0x0
                                     );
          lVar12 = (long)(int)sVar6;
          bs = (bs - lVar22) - lVar12;
          local_38 = buffer + lVar22 + lVar12;
          local_48 = (char *)(lVar12 + lVar22);
          uStack_f0 = 0x10d1a4;
          iVar2 = rtosc_arg_rep_num(arg_00);
          goto LAB_0010d351;
        }
      }
      uStack_f0 = 0x10c92a;
      iVar2 = rtosc_arg_rep_has_delta(arg_00);
      prVar16 = arg + (ulong)(iVar2 != 0) + 1;
      uStack_f0 = 0x10c956;
      sVar6 = rtosc_print_arg_val(prVar16,buffer,bs,(rtosc_print_options *)opt_00,cols_used,
                                  (rtosc_arg_val_t *)0x0);
      local_48 = (char *)(long)(int)sVar6;
      sVar6 = bs - (long)local_48;
      local_38 = buffer + (long)local_48;
      uStack_f0 = 0x10c96c;
      iVar2 = rtosc_arg_rep_has_delta(arg_00);
      if (iVar2 != 0) {
        uStack_f0 = 0x10c992;
        rtosc_arg_val_from_int((rtosc_arg_val_t *)local_a0,prVar16->type,1);
        uStack_f0 = 0x10c9a8;
        rtosc_arg_val_from_int((rtosc_arg_val_t *)(auStack_e8 + 8),prVar16->type,-1);
        if ((prev_arg_if_range == (rtosc_arg_val_t *)0x0) ||
           (prev_arg_if_range->type != prVar16->type)) {
          bVar24 = false;
        }
        else {
          uStack_f0 = 0x10c9cb;
          iVar4 = rtosc_arg_vals_eq_single(prVar16,prev_arg_if_range,(rtosc_cmp_options *)0x0);
          bVar24 = iVar4 == 0;
        }
        uStack_f0 = 0x10d1d4;
        iVar4 = rtosc_arg_vals_eq_single
                          (arg + 1,(rtosc_arg_val_t *)local_a0,(rtosc_cmp_options *)0x0);
        if (iVar4 == 0) {
          uStack_f0 = 0x10d26d;
          iVar4 = rtosc_arg_vals_eq_single
                            (arg + 1,(rtosc_arg_val_t *)(auStack_e8 + 8),(rtosc_cmp_options *)0x0);
          if (iVar4 == 0 || bVar24) goto LAB_0010d284;
        }
        else if (bVar24) {
LAB_0010d284:
          uStack_f0 = 0x10d28f;
          iVar2 = rtosc_arg_rep_num(arg_00);
          if (iVar2 != 0) {
            uStack_f0 = 0x10d2a7;
            asnprintf(local_38,sVar6," ");
            *cols_used = *cols_used + 1;
            uStack_f0 = 0x10d2cc;
            rtosc_arg_val_range_arg(arg,1,(rtosc_arg_val_t *)((long)&m_one.val + 8));
            uStack_f0 = 0x10d2ef;
            sVar11 = rtosc_print_arg_val((rtosc_arg_val_t *)((long)&m_one.val + 8),local_38 + 1,
                                         sVar6 - 1,(rtosc_print_options *)opt_00,cols_used,
                                         (rtosc_arg_val_t *)0x0);
            lVar12 = (long)(int)sVar11;
            sVar6 = (sVar6 - 1) - lVar12;
            local_38 = local_38 + lVar12 + 1;
            local_48 = (char *)((long)local_48 + lVar12 + 1);
          }
        }
      }
      uStack_f0 = 0x10d31c;
      asnprintf(local_38,sVar6," ... ");
      bs = sVar6 - 5;
      local_38 = local_38 + 5;
      local_48 = (char *)((long)local_48 + 5);
      *cols_used = *cols_used + 5;
      uStack_f0 = 0x10d33c;
      iVar2 = rtosc_arg_rep_num(arg_00);
      uStack_f0 = 0x10d347;
      iVar5 = rtosc_arg_rep_num(arg_00);
      iVar2 = iVar2 + -1 + (uint)(iVar5 == 0);
    }
LAB_0010d351:
    uStack_f0 = 0x10d359;
    iVar5 = rtosc_arg_rep_num(arg_00);
    if (iVar2 < iVar5) {
      uVar13 = (uint)(cols_used != (int *)0x0);
      pcVar21 = local_38 + -1;
      local_50._0_4_ = iVar2;
      do {
        uStack_f0 = 0x10d397;
        iVar5 = rtosc_arg_rep_has_delta(arg_00);
        prVar16 = arg + 1;
        if (iVar5 != 0) {
          prVar16 = (rtosc_arg_val_t *)local_a0;
          uStack_f0 = 0x10d3b4;
          rtosc_arg_val_range_arg(arg,(int)local_50,prVar16);
        }
        uStack_f0 = 0x10d3d7;
        sVar6 = rtosc_print_arg_val(prVar16,local_38,bs,(rtosc_print_options *)opt_00,cols_used,
                                    (rtosc_arg_val_t *)0x0);
        lVar12 = (long)(int)sVar6;
        lVar22 = bs - lVar12;
        local_38 = local_38 + lVar12;
        lVar12 = (long)local_48 + lVar12;
        uVar3 = uVar13 + 1;
        if ((((rtosc_print_options *)opt_00)->linelength < *cols_used) && (0 < (int)uVar13)) {
          *pcVar21 = '\n';
          uStack_f0 = 0x10d420;
          memmove(pcVar21 + 5,pcVar21 + 1,sVar6 + 1);
          pcVar21[1] = ' ';
          pcVar21[2] = ' ';
          pcVar21[3] = ' ';
          pcVar21[4] = ' ';
          *cols_used = (int)sVar6 + 4;
          lVar12 = lVar12 + 4;
          lVar22 = lVar22 + -4;
          local_38 = local_38 + 4;
          uVar3 = 1;
        }
        uVar13 = uVar3;
        pcVar21 = local_38;
        local_38 = pcVar21 + 1;
        *pcVar21 = ' ';
        bs = lVar22 - 1;
        local_48 = (char *)(lVar12 + 1);
        *cols_used = *cols_used + 1;
        local_50._0_4_ = (int)local_50 + 1;
        uStack_f0 = 0x10d47d;
        iVar5 = rtosc_arg_rep_num(arg_00);
      } while ((int)local_50 < iVar5);
    }
    uStack_f0 = 0x10d4a6;
    iVar5 = rtosc_arg_rep_num(arg_00);
    if (iVar2 < iVar5) {
      local_38[-1] = '\0';
      local_48._0_4_ = (int)local_48 + -1;
    }
    local_48 = (char *)(long)(int)local_48;
    goto switchD_0010c7de_caseD_65;
  }
  local_48 = pcVar21;
  switch(bVar15) {
  case 0x61:
    uStack_f0 = 0x10cab8;
    uVar13 = rtosc_arg_arr_len(arg_00);
    lVar12 = -((ulong)uVar13 * 0x18 + 0xf & 0xfffffffffffffff0);
    *buffer = '[';
    *cols_used = *cols_used + 1;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10caf5;
    iVar2 = rtosc_arg_arr_len(arg_00);
    if (iVar2 == 0) {
      buffer[1] = ' ';
      *cols_used = *cols_used + 1;
      pcVar21 = buffer + 2;
      local_48 = (char *)0x2;
    }
    else {
      pcVar21 = buffer + 1;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10cb09;
      iVar2 = rtosc_arg_arr_len(arg_00);
      if (iVar2 < 1) {
        local_48 = (char *)0x1;
      }
      else {
        local_48 = (char *)0x1;
        iVar4 = 1;
        local_38 = buffer + -1;
        uVar13 = (uint)(cols_used != (int *)0x0);
        do {
          prVar16 = arg + iVar4;
          *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10cb5e;
          iVar2 = rtosc_arg_arr_len(arg_00);
          *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10cb7f;
          iVar2 = rtosc_convert_to_range
                            (prVar16,(long)((iVar2 - iVar4) + 1),
                             (rtosc_arg_val_t *)(auStack_e8 + lVar12),(rtosc_print_options *)opt_00)
          ;
          arg_01 = (rtosc_arg_val_t *)(auStack_e8 + lVar12);
          if (iVar2 == 0) {
            arg_01 = prVar16;
          }
          prev_arg_if_range_00 = arg + (long)iVar4 + -1;
          if (iVar4 == 1) {
            prev_arg_if_range_00 = (rtosc_arg_val_t *)0x0;
          }
          *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10cbc2;
          sVar6 = rtosc_print_arg_val(arg_01,pcVar21,bs - 1,(rtosc_print_options *)opt_00,cols_used,
                                      prev_arg_if_range_00);
          if (iVar2 == 0) {
            *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10cbd5;
            iVar2 = next_arg_offset(prVar16);
          }
          lVar22 = (long)(int)sVar6;
          local_50 = (bs - 1) - lVar22;
          pcVar20 = pcVar21 + lVar22;
          local_48 = local_48 + lVar22;
          uVar3 = uVar13 + 1;
          if ((((rtosc_print_options *)opt_00)->linelength < *cols_used) && (0 < (int)uVar13)) {
            *local_38 = '\n';
            *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10cc27;
            memmove(local_38 + 5,local_38 + 1,sVar6 + 1);
            local_38[1] = ' ';
            local_38[2] = ' ';
            local_38[3] = ' ';
            local_38[4] = ' ';
            *cols_used = (int)sVar6 + 4;
            local_48 = local_48 + 4;
            pcVar20 = pcVar20 + 4;
            local_50 = local_50 - 4;
            uVar3 = 1;
          }
          iVar4 = iVar4 + iVar2;
          pcVar21 = pcVar20 + 1;
          *pcVar20 = ' ';
          local_48 = local_48 + 1;
          *cols_used = *cols_used + 1;
          *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10cc84;
          iVar2 = rtosc_arg_arr_len(arg_00);
          bs = local_50;
          local_38 = pcVar20;
          uVar13 = uVar3;
        } while (iVar4 <= iVar2);
      }
    }
    pcVar21[-1] = ']';
    pcVar21[0] = '\0';
    *cols_used = *cols_used + 1;
    goto switchD_0010c7de_caseD_65;
  case 0x62:
    uStack_f0 = 0x10cd0a;
    iVar4 = asnprintf(buffer,bs,"BLOB [%d ",(ulong)(uint)arg_00->i);
    local_48 = (char *)(long)iVar4;
    *cols_used = *cols_used + iVar4;
    pcVar21 = buffer + (long)local_48;
    if (0 < arg_00->i) {
      lVar12 = 0;
      do {
        if (((rtosc_print_options *)opt_00)->linelength + -6 <= *cols_used) {
          uStack_f0 = 0x10cd5a;
          iVar4 = asnprintf(pcVar21 + -1,bs + 1,"\n    ");
          local_48 = local_48 + (long)iVar4 + -1;
          pcVar21 = pcVar21 + (long)iVar4 + -1;
          *cols_used = 4;
        }
        uStack_f0 = 0x10cd96;
        asnprintf(pcVar21,bs,"0x%02x ",(ulong)(arg->val).b.data[lVar12]);
        bs = bs - 5;
        pcVar21 = pcVar21 + 5;
        *cols_used = *cols_used + 5;
        local_48 = local_48 + 5;
        lVar12 = lVar12 + 1;
      } while (lVar12 < (arg->val).i);
    }
    pcVar21[-1] = ']';
    goto switchD_0010c7de_caseD_65;
  case 99:
    uVar13 = arg_00->i;
    uStack_f0 = 0x10ccb6;
    uVar3 = as_escaped_char(uVar13,1);
    pcVar21 = "\\";
    if (uVar3 == 0xffffffff) {
      pcVar21 = "";
      uVar3 = uVar13;
    }
    uStack_f0 = 0x10cce6;
    iVar4 = asnprintf(buffer,bs,"\'%s%c\'",pcVar21,(ulong)uVar3);
    break;
  case 100:
  case 0x66:
    if (bVar15 == 0x66) {
      uStack_f0 = 0x10c810;
      asnprintf(local_a0,6,"%%#.%df",
                (ulong)(uint)((rtosc_print_options *)opt_00)->floating_point_precision);
      uStack_f0 = 0x10c82b;
      iVar4 = asnprintf(buffer,bs,local_a0,(double)arg_00->f);
      local_48 = (char *)(long)iVar4;
      if (((rtosc_print_options *)opt_00)->lossless == true) {
        uStack_f0 = 0x10c85c;
        iVar4 = asnprintf(buffer + (long)local_48,bs - (long)local_48," (%a)",(double)arg_00->f);
        uStack_f0 = 0x10c873;
        sVar6 = remove_trailing_zeroes(buffer + (long)(local_48 + 2));
        local_48 = local_48 + ((long)iVar4 - sVar6);
      }
    }
    else {
      uStack_f0 = 0x10cef7;
      asnprintf(local_a0,8,"%%#.%dlfd",
                (ulong)(uint)((rtosc_print_options *)opt_00)->floating_point_precision);
      uStack_f0 = 0x10cf13;
      iVar4 = asnprintf(buffer,bs,local_a0,arg_00->d);
      local_48 = (char *)(long)iVar4;
      if (((rtosc_print_options *)opt_00)->lossless == true) {
        uStack_f0 = 0x10cf3d;
        iVar4 = asnprintf(buffer + (long)local_48,bs - (long)local_48," (%la)",arg_00->d);
        local_48 = local_48 + iVar4;
      }
    }
  case 0x65:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
    goto switchD_0010c7de_caseD_65;
  case 0x68:
    uStack_f0 = 0x10ced2;
    iVar4 = asnprintf(buffer,bs,"%ldh",arg_00->d);
    break;
  case 0x69:
    uStack_f0 = 0x10ca6f;
    iVar4 = asnprintf(buffer,bs,"%d",(ulong)(uint)arg_00->i);
    break;
  case 0x6d:
    uVar14 = (ulong)(arg->val).m[0];
    uVar17 = (ulong)(arg->val).m[1];
    uVar18 = (ulong)(arg->val).m[2];
    uVar19 = (ulong)(arg->val).m[3];
    pcVar21 = "MIDI [0x%02x 0x%02x 0x%02x 0x%02x]";
    goto LAB_0010ca93;
  case 0x72:
    uVar13 = arg_00->i;
    uVar14 = (ulong)(uVar13 >> 0x18);
    uVar17 = (ulong)(uVar13 >> 0x10 & 0xff);
    uVar18 = (ulong)(uVar13 >> 8 & 0xff);
    uVar19 = (ulong)(uVar13 & 0xff);
    pcVar21 = "#%02x%02x%02x%02x";
LAB_0010ca93:
    iVar4 = asnprintf(buffer,bs,pcVar21,uVar14,uVar17,uVar18,uVar19);
    break;
  case 0x73:
LAB_0010cdca:
    bVar15 = 0;
    goto LAB_0010cdcc;
  case 0x74:
    uStack_f0 = 0x10c9fc;
    _Var1 = rtosc_arg_val_is_immediatelly(arg);
    if (!_Var1) {
      uStack_f0 = 0x10d00e;
      __tp = rtosc_params_from_arg_val(arg);
      uStack_f0 = 0x10d019;
      uVar8 = rtosc_secfracs_from_arg_val(arg);
      if ((int)uVar8 == 0) {
        if (__tp->tm_sec == 0) {
          if (__tp->tm_hour == 0) {
            pcVar21 = "%Y-%m-%d %H:%M";
            if (__tp->tm_min == 0) {
              pcVar21 = "%Y-%m-%d";
            }
          }
          else {
            pcVar21 = "%Y-%m-%d %H:%M";
          }
        }
        else {
          pcVar21 = "%Y-%m-%d %H:%M:%S";
        }
        uStack_f0 = 0x10d541;
        local_48 = (char *)strftime(buffer,bs,pcVar21,(tm *)__tp);
      }
      else {
        uStack_f0 = 0x10d042;
        sVar9 = strftime(buffer,bs,"%Y-%m-%d %H:%M:%S",(tm *)__tp);
        iVar4 = ((rtosc_print_options *)opt_00)->floating_point_precision;
        uStack_f0 = 0x10d057;
        fVar25 = rtosc_secfracs2float((long)(int)uVar8);
        uStack_f0 = 0x10d07c;
        asnprintf(local_a0,5,"%%.%df",iVar4);
        uStack_f0 = 0x10d0a1;
        iVar4 = asnprintf(buffer + sVar9,bs - sVar9,local_a0);
        local_48 = buffer + (int)sVar9;
        uStack_f0 = 0x10d0ba;
        pcVar21 = strchr(local_48,0x2e);
        uStack_f0 = 0x10d0c5;
        sVar10 = strlen(pcVar21);
        uStack_f0 = 0x10d0d4;
        memmove(local_48,pcVar21,sVar10 + 1);
        local_48 = local_48 + (((long)iVar4 + sVar9) - (long)pcVar21);
        if (((rtosc_print_options *)opt_00)->lossless == true) {
          uStack_f0 = 0x10d105;
          iVar4 = asnprintf(buffer + (long)local_48,bs - (long)local_48," (...+%as)",(double)fVar25)
          ;
          uStack_f0 = 0x10d118;
          sVar6 = remove_trailing_zeroes(buffer + (long)(local_48 + 6));
          local_48 = local_48 + ((long)iVar4 - sVar6);
        }
      }
      goto switchD_0010c7de_caseD_65;
    }
    uStack_f0 = 0x10ca19;
    iVar4 = asnprintf(buffer,bs,"immediately");
    break;
  default:
    if (bVar15 != 0x53) {
      if (bVar15 == 0x54) {
        uStack_f0 = 0x10c8f2;
        fast_strcpy(buffer,"true",bs);
        local_48 = (char *)0x4;
      }
      goto switchD_0010c7de_caseD_65;
    }
    pcVar21 = arg_00->s;
    cVar23 = *pcVar21;
    if ((long)cVar23 != 0x5f) {
      uStack_f0 = 0x10cf8b;
      ppuVar7 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar7 + (long)cVar23 * 2 + 1) & 4) == 0) goto LAB_0010cdca;
    }
    cVar23 = pcVar21[1];
    if (cVar23 == '\0') {
      bVar15 = 1;
    }
    else {
      pcVar21 = pcVar21 + 2;
      do {
        bVar15 = 1;
        if (cVar23 != '_') {
          uStack_f0 = 0x10cfb7;
          ppuVar7 = __ctype_b_loc();
          bVar15 = ((byte)(*ppuVar7)[cVar23] & 8) >> 3;
        }
        cVar23 = *pcVar21;
      } while ((cVar23 != '\0') && (pcVar21 = pcVar21 + 1, bVar15 != 0));
    }
LAB_0010cdcc:
    pcVar21 = buffer;
    if (bVar15 == 0) {
      pcVar21 = buffer + 1;
      *buffer = '\"';
      *cols_used = *cols_used + 1;
    }
    cVar23 = *arg_00->s;
    pcVar20 = arg_00->s;
    while (cVar23 != '\0') {
      if ((bVar15 == 0) && (((rtosc_print_options *)opt_00)->linelength + -3 < *cols_used)) {
        uStack_f0 = 0x10ce23;
        iVar4 = asnprintf(pcVar21,bs,"\"\\\n    \"");
        pcVar21 = pcVar21 + iVar4;
        *cols_used = 5;
      }
      cVar23 = *pcVar20;
      uStack_f0 = 0x10ce3f;
      iVar4 = as_escaped_char((int)cVar23,0);
      if (iVar4 == -1) {
        *pcVar21 = cVar23;
        pcVar21 = pcVar21 + 1;
        iVar4 = *cols_used + 1;
LAB_0010ce93:
        *cols_used = iVar4;
      }
      else {
        *pcVar21 = '\\';
        pcVar21[1] = (char)iVar4;
        *cols_used = *cols_used + 2;
        pcVar21 = pcVar21 + 2;
        if (iVar4 == 0x6e && bVar15 == 0) {
          uStack_f0 = 0x10ce76;
          iVar4 = asnprintf(pcVar21,bs,"\"\\\n    \"");
          pcVar21 = pcVar21 + iVar4;
          iVar4 = 5;
          goto LAB_0010ce93;
        }
      }
      cVar23 = pcVar20[1];
      pcVar20 = pcVar20 + 1;
    }
    if (bVar15 == 0) {
      *pcVar21 = '\"';
      *cols_used = *cols_used + 1;
      if (arg->type == 'S') {
        pcVar21[1] = 'S';
        pcVar21 = pcVar21 + 2;
      }
      else {
        pcVar21 = pcVar21 + 1;
      }
    }
    *pcVar21 = '\0';
    local_48 = pcVar21 + -(long)buffer;
    goto switchD_0010c7de_caseD_65;
  }
  local_48 = (char *)(long)iVar4;
switchD_0010c7de_caseD_65:
  uVar13 = (byte)arg->type - 0x53;
  if (((0x20 < uVar13) || ((0x10000c001U >> ((ulong)uVar13 & 0x3f) & 1) == 0)) &&
     (arg->type != 0x2d)) {
    *cols_used = *cols_used + (int)local_48;
  }
  return (size_t)local_48;
}

Assistant:

size_t rtosc_print_arg_val(const rtosc_arg_val_t *arg,
                           char *buffer, size_t bs,
                           const rtosc_print_options* opt, int *cols_used, const rtosc_arg_val_t* prev_arg_if_range)
{
    size_t wrt = 0;
    if(!opt)
        opt = default_print_options;
    assert(arg);
    const rtosc_arg_t* val = &arg->val;

    switch(arg->type)
    {
        case 'T':
            assert(bs>4);
            fast_strcpy(buffer, "true", bs);
            wrt = 4;
            break;
        case 'F':
            assert(bs>5);
            fast_strcpy(buffer, "false", bs);
            wrt = 5;
            break;
        case 'N':
            assert(bs>3);
            fast_strcpy(buffer, "nil", bs);
            wrt = 3;
            break;
        case 'I':
            assert(bs>3);
            fast_strcpy(buffer, "inf", bs);
            wrt = 3;
            break;
        case 'h':
            wrt = asnprintf(buffer, bs, "%"PRId64"h", val->h);
            break;
        case 't': // write to ISO 8601 date
        {
            if(rtosc_arg_val_is_immediatelly(arg))
                wrt = asnprintf(buffer, bs, "immediately");
            else
            {
                struct tm* m_tm = rtosc_params_from_arg_val(arg);
                int32_t secfracs = rtosc_secfracs_from_arg_val(arg);

                const char* strtimefmt = (secfracs || m_tm->tm_sec)
                                  ? "%Y-%m-%d %H:%M:%S"
                                  : (m_tm->tm_hour || m_tm->tm_min)
                                    ? "%Y-%m-%d %H:%M"
                                    : "%Y-%m-%d";

                wrt = strftime(buffer, bs, strtimefmt, m_tm);
                assert(wrt);

                if(secfracs)
                {
                    int prec = opt->floating_point_precision;
                    assert(prec>=0);
                    assert(prec<100);

                    // convert fractions -> float
                    float flt = rtosc_secfracs2float(secfracs);

                    // append float
                    char fmtstr[8];
                    asnprintf(fmtstr, 5, "%%.%df", prec);
                    int lastwrt = wrt;
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     fmtstr, flt);
                    // snip part before separator
                    const char* sep = strchr(buffer + lastwrt, '.');
                    assert(sep);
                    memmove(buffer + lastwrt, sep, strlen(sep)+1);
                    wrt -= (sep - (buffer + lastwrt));

                    if(opt->lossless) {
                        char* last_pos = buffer + wrt;
                        wrt += asnprintf(buffer + wrt, bs - wrt,
                                         " (...+%as)", flt);
                        wrt -= remove_trailing_zeroes(last_pos+6);
                    }
                } // if secfracs
            } // else
            break;
        }
        case 'r':
            wrt = asnprintf(buffer, bs, "#%02x%02x%02x%02x",
                      (val->i >> 24) & 0xff,
                      (val->i >> 16) & 0xff,
                      (val->i >>  8) & 0xff,
                       val->i        & 0xff
                      );
            break;
        case 'd':
        case 'f':
        {
            int prec = opt->floating_point_precision;
            assert(prec>=0);
            assert(prec<100);
            char fmtstr[9];
            if(arg->type == 'f')
            {
                // e.g. "%.42f" or "%.0f.":
                asnprintf(fmtstr, 6, "%%#.%df", prec);
                wrt = asnprintf(buffer, bs, fmtstr, val->f);
                if(opt->lossless)
                {
                    char* last_pos = buffer + wrt;
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     " (%a)", val->f);
                    wrt -= remove_trailing_zeroes(last_pos+2);
                }
            }
            else
            {
                // e.g. "%.42lfd" or "%.0lf.d"
                asnprintf(fmtstr, 8, "%%#.%dlfd", prec);
                wrt = asnprintf(buffer, bs, fmtstr, val->d);
                if(opt->lossless)
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     " (%la)", val->d);
            }
            break;
        }
        case 'c':
        {
            int is_esc = (as_escaped_char(val->i, true) != -1);
            wrt = asnprintf(buffer, bs, "'%s%c'",
                            is_esc ? "\\" : "",
                            is_esc ? as_escaped_char(val->i, true)
                                   : val->i);
            break;
        }
        case 'i':
            wrt = asnprintf(buffer, bs, "%"PRId32, val->i);
            break;
        case 'm':
            wrt = asnprintf(buffer, bs, "MIDI [0x%02x 0x%02x 0x%02x 0x%02x]",
                            val->m[0], val->m[1], val->m[2], val->m[3]);
            break;
        case 's':
        case 'S':
        {
            bool plain; // e.g. without quotes
            if(arg->type == 'S')
            {
                plain = true; // "Symbol": are quotes required?
                if(*val->s != '_' && !isalpha(*val->s))
                    plain = false;
                else for(const char* s = val->s + 1; *s && plain; ++s)
                    plain = (*s == '_' || (isalnum(*s)));
            }
            else plain = false;

            char* b = buffer;
            if(!plain)
            {
                *b++ = '"';
                ++*cols_used;
            }
            for(const char* s = val->s; *s; ++s)
            {
                // "3": 2 quote signs and escaping backslash
                if(!plain && *cols_used > opt->linelength - 3)
                    break_string(&b, bs, cols_used);
                assert(bs);
                int as_esc = as_escaped_char(*s, false);
                if(as_esc != -1) {
                    assert(bs-1);
                    *b++ = '\\';
                    *b++ = as_esc;
                    *cols_used += 2;
                    if(!plain && as_esc == 'n')
                        break_string(&b, bs, cols_used);
                }
                else {
                    *b++ = *s;
                    ++*cols_used;
                }
            }

            if(plain)
                assert(bs);
            else
            {
                assert(bs >= 2);
                *b++ = '"';
                ++*cols_used;
                if(arg->type == 'S') {
                    assert(bs >= 2);
                    *b++ = 'S';
                }
            }
            *b = 0;
            wrt += (b-buffer);
            break;
        }
        case 'b':
            wrt = asnprintf(buffer, bs, "BLOB [%d ", val->b.len);
            *cols_used += wrt;
            buffer += wrt;
            for(int32_t i = 0; i < val->b.len; ++i)
            {
                if(*cols_used >= opt->linelength - 6)
                {
                    int tmp = asnprintf(buffer-1, bs+1, "\n    ");
                    wrt += (tmp-1);
                    buffer += (tmp-1);
                    *cols_used = 4;
                }
                asnprintf(buffer, bs, "0x%02x ", val->b.data[i]);
                COUNT_UP_COL(5);
            }
            buffer[-1] = ']';
            break;
        case 'a':
        {
            char* last_sep = buffer - 1;
            int args_written_this_line = (cols_used) ? 1 : 0;
            STACKALLOC(rtosc_arg_val_t, args_converted, rtosc_arg_arr_len(val)); // range conversion

            COUNT_UP_WRITE('[');
            if(rtosc_arg_arr_len(val))
            for(int32_t i = 1; i <= rtosc_arg_arr_len(val); )
            {
                int32_t conv = rtosc_convert_to_range(arg+i, rtosc_arg_arr_len(val)+1-i, args_converted, opt);
                const rtosc_arg_val_t* input = conv ? args_converted : arg+i;

                size_t tmp = rtosc_print_arg_val(input, buffer, bs,
                                                 opt, cols_used, (i == 1) ? NULL : arg + i -1);
                i += conv ? conv : next_arg_offset(arg+i);
                COUNT_UP(tmp);

                linebreak_check_after_write(cols_used, &wrt,
                                            last_sep, &buffer, &bs,
                                            tmp, &args_written_this_line,
                                            opt->linelength);

                last_sep = buffer;
                COUNT_UP_WRITE(' ');
            }
            else
                COUNT_UP_WRITE(' ');

            assert(bs);
            buffer[-1] = ']';
            *buffer = 0;
            ++*cols_used;
            --bs;
            break;
        }
        case '-':
        {
            wrt += rtosc_print_range(arg, buffer, bs, opt, cols_used, prev_arg_if_range);
            break;
        }
        default:
            ;
    }

    switch(arg->type)
    {
        case '-':
        case 'a':
        case 's':
        case 'S':
        case 'b':
            // these can break the line, so they compute *cols_used themselves
            break;
        default:
            *cols_used += wrt;
    }

    return wrt;
}